

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deflate.c
# Opt level: O0

int deflate(z_streamp_conflict strm,int flush)

{
  byte bVar1;
  Bytef BVar2;
  int iVar3;
  uint uVar4;
  int iVar5;
  uInt uVar6;
  deflate_state *s_00;
  Bytef *pBVar7;
  bool bVar8;
  uLong uVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  block_state local_60;
  block_state local_5c;
  Bytef local_54;
  Bytef local_4c;
  block_state bstate;
  int val_1;
  uInt beg_2;
  int val;
  uInt beg_1;
  uInt beg;
  uInt level_flags;
  uInt header;
  deflate_state *s;
  int old_flush;
  int flush_local;
  z_streamp_conflict strm_local;
  
  if ((((strm == (z_streamp_conflict)0x0) || (strm->state == (internal_state_conflict *)0x0)) ||
      (5 < flush)) || (flush < 0)) {
    strm_local._4_4_ = 0xfffffffe;
  }
  else {
    s_00 = (deflate_state *)strm->state;
    if (((strm->next_out == (Bytef *)0x0) ||
        ((strm->next_in == (Bytef *)0x0 && (strm->avail_in != 0)))) ||
       ((s_00->status == 0x29a && (flush != 4)))) {
      strm->msg = "stream error";
      strm_local._4_4_ = 0xfffffffe;
    }
    else if (strm->avail_out == 0) {
      strm->msg = "buffer error";
      strm_local._4_4_ = 0xfffffffb;
    }
    else {
      s_00->strm = strm;
      iVar3 = s_00->last_flush;
      s_00->last_flush = flush;
      if (s_00->status == 0x2a) {
        if (s_00->wrap == 2) {
          uVar9 = crc32(0,(uchar *)0x0,0);
          strm->adler = uVar9;
          uVar4 = s_00->pending;
          s_00->pending = uVar4 + 1;
          s_00->pending_buf[uVar4] = '\x1f';
          uVar4 = s_00->pending;
          s_00->pending = uVar4 + 1;
          s_00->pending_buf[uVar4] = 0x8b;
          uVar4 = s_00->pending;
          s_00->pending = uVar4 + 1;
          s_00->pending_buf[uVar4] = '\b';
          if (s_00->gzhead == (gz_headerp)0x0) {
            uVar4 = s_00->pending;
            s_00->pending = uVar4 + 1;
            s_00->pending_buf[uVar4] = '\0';
            uVar4 = s_00->pending;
            s_00->pending = uVar4 + 1;
            s_00->pending_buf[uVar4] = '\0';
            uVar4 = s_00->pending;
            s_00->pending = uVar4 + 1;
            s_00->pending_buf[uVar4] = '\0';
            uVar4 = s_00->pending;
            s_00->pending = uVar4 + 1;
            s_00->pending_buf[uVar4] = '\0';
            uVar4 = s_00->pending;
            s_00->pending = uVar4 + 1;
            s_00->pending_buf[uVar4] = '\0';
            if (s_00->level == 9) {
              local_4c = '\x02';
            }
            else {
              bVar8 = true;
              if (s_00->strategy < 2) {
                bVar8 = s_00->level < 2;
              }
              local_4c = '\0';
              if (bVar8) {
                local_4c = '\x04';
              }
            }
            uVar4 = s_00->pending;
            s_00->pending = uVar4 + 1;
            s_00->pending_buf[uVar4] = local_4c;
            uVar4 = s_00->pending;
            s_00->pending = uVar4 + 1;
            s_00->pending_buf[uVar4] = '\x03';
            s_00->status = 0x71;
          }
          else {
            iVar5 = s_00->gzhead->text;
            cVar10 = '\0';
            if (s_00->gzhead->hcrc != 0) {
              cVar10 = '\x02';
            }
            cVar11 = '\x04';
            if (s_00->gzhead->extra == (Bytef *)0x0) {
              cVar11 = '\0';
            }
            cVar12 = '\b';
            if (s_00->gzhead->name == (Bytef *)0x0) {
              cVar12 = '\0';
            }
            cVar13 = '\x10';
            if (s_00->gzhead->comment == (Bytef *)0x0) {
              cVar13 = '\0';
            }
            uVar4 = s_00->pending;
            s_00->pending = uVar4 + 1;
            s_00->pending_buf[uVar4] = (iVar5 != 0) + cVar10 + cVar11 + cVar12 + cVar13;
            uVar9 = s_00->gzhead->time;
            uVar4 = s_00->pending;
            s_00->pending = uVar4 + 1;
            s_00->pending_buf[uVar4] = (Bytef)uVar9;
            uVar9 = s_00->gzhead->time;
            uVar4 = s_00->pending;
            s_00->pending = uVar4 + 1;
            s_00->pending_buf[uVar4] = (Bytef)(uVar9 >> 8);
            uVar9 = s_00->gzhead->time;
            uVar4 = s_00->pending;
            s_00->pending = uVar4 + 1;
            s_00->pending_buf[uVar4] = (Bytef)(uVar9 >> 0x10);
            uVar9 = s_00->gzhead->time;
            uVar4 = s_00->pending;
            s_00->pending = uVar4 + 1;
            s_00->pending_buf[uVar4] = (Bytef)(uVar9 >> 0x18);
            if (s_00->level == 9) {
              local_54 = '\x02';
            }
            else {
              bVar8 = true;
              if (s_00->strategy < 2) {
                bVar8 = s_00->level < 2;
              }
              local_54 = '\0';
              if (bVar8) {
                local_54 = '\x04';
              }
            }
            uVar4 = s_00->pending;
            s_00->pending = uVar4 + 1;
            s_00->pending_buf[uVar4] = local_54;
            iVar5 = s_00->gzhead->os;
            uVar4 = s_00->pending;
            s_00->pending = uVar4 + 1;
            s_00->pending_buf[uVar4] = (Bytef)iVar5;
            if (s_00->gzhead->extra != (Bytef *)0x0) {
              uVar6 = s_00->gzhead->extra_len;
              uVar4 = s_00->pending;
              s_00->pending = uVar4 + 1;
              s_00->pending_buf[uVar4] = (Bytef)uVar6;
              uVar6 = s_00->gzhead->extra_len;
              uVar4 = s_00->pending;
              s_00->pending = uVar4 + 1;
              s_00->pending_buf[uVar4] = (Bytef)(uVar6 >> 8);
            }
            if (s_00->gzhead->hcrc != 0) {
              uVar9 = crc32(strm->adler,s_00->pending_buf,s_00->pending);
              strm->adler = uVar9;
            }
            s_00->gzindex = 0;
            s_00->status = 0x45;
          }
        }
        else {
          if ((s_00->strategy < 2) && (1 < s_00->level)) {
            if (s_00->level < 6) {
              beg_1 = 1;
            }
            else if (s_00->level == 6) {
              beg_1 = 2;
            }
            else {
              beg_1 = 3;
            }
          }
          else {
            beg_1 = 0;
          }
          beg = beg_1 << 6 | ((s_00->w_bits - 8) * 0x10 + 8) * 0x100;
          if (s_00->strstart != 0) {
            beg = beg | 0x20;
          }
          s_00->status = 0x71;
          putShortMSB(s_00,(0x1f - beg % 0x1f) + beg);
          if (s_00->strstart != 0) {
            putShortMSB(s_00,(uInt)(strm->adler >> 0x10));
            putShortMSB(s_00,(uint)strm->adler & 0xffff);
          }
          uVar9 = adler32(0,(Bytef *)0x0,0);
          strm->adler = uVar9;
        }
      }
      if (s_00->status == 0x45) {
        if (s_00->gzhead->extra == (Bytef *)0x0) {
          s_00->status = 0x49;
        }
        else {
          val = s_00->pending;
          while (s_00->gzindex < (s_00->gzhead->extra_len & 0xffff)) {
            if ((ulong)s_00->pending == s_00->pending_buf_size) {
              if ((s_00->gzhead->hcrc != 0) && ((uint)val < s_00->pending)) {
                uVar9 = crc32(strm->adler,s_00->pending_buf + (uint)val,s_00->pending - val);
                strm->adler = uVar9;
              }
              flush_pending(strm);
              val = s_00->pending;
              if ((ulong)s_00->pending == s_00->pending_buf_size) break;
            }
            BVar2 = s_00->gzhead->extra[s_00->gzindex];
            uVar4 = s_00->pending;
            s_00->pending = uVar4 + 1;
            s_00->pending_buf[uVar4] = BVar2;
            s_00->gzindex = s_00->gzindex + 1;
          }
          if ((s_00->gzhead->hcrc != 0) && ((uint)val < s_00->pending)) {
            uVar9 = crc32(strm->adler,s_00->pending_buf + (uint)val,s_00->pending - val);
            strm->adler = uVar9;
          }
          if (s_00->gzindex == s_00->gzhead->extra_len) {
            s_00->gzindex = 0;
            s_00->status = 0x49;
          }
        }
      }
      if (s_00->status == 0x49) {
        if (s_00->gzhead->name == (Bytef *)0x0) {
          s_00->status = 0x5b;
        }
        else {
          beg_2 = s_00->pending;
          do {
            if ((ulong)s_00->pending == s_00->pending_buf_size) {
              if ((s_00->gzhead->hcrc != 0) && (beg_2 < s_00->pending)) {
                uVar9 = crc32(strm->adler,s_00->pending_buf + beg_2,s_00->pending - beg_2);
                strm->adler = uVar9;
              }
              flush_pending(strm);
              beg_2 = s_00->pending;
              if ((ulong)s_00->pending == s_00->pending_buf_size) {
                val_1 = 1;
                break;
              }
            }
            pBVar7 = s_00->gzhead->name;
            uVar4 = s_00->gzindex;
            s_00->gzindex = uVar4 + 1;
            bVar1 = pBVar7[uVar4];
            val_1 = (int)bVar1;
            uVar4 = s_00->pending;
            s_00->pending = uVar4 + 1;
            s_00->pending_buf[uVar4] = bVar1;
          } while (val_1 != 0);
          if ((s_00->gzhead->hcrc != 0) && (beg_2 < s_00->pending)) {
            uVar9 = crc32(strm->adler,s_00->pending_buf + beg_2,s_00->pending - beg_2);
            strm->adler = uVar9;
          }
          if (val_1 == 0) {
            s_00->gzindex = 0;
            s_00->status = 0x5b;
          }
        }
      }
      if (s_00->status == 0x5b) {
        if (s_00->gzhead->comment == (Bytef *)0x0) {
          s_00->status = 0x67;
        }
        else {
          bstate = s_00->pending;
          do {
            if ((ulong)s_00->pending == s_00->pending_buf_size) {
              if ((s_00->gzhead->hcrc != 0) && (bstate < s_00->pending)) {
                uVar9 = crc32(strm->adler,s_00->pending_buf + bstate,s_00->pending - bstate);
                strm->adler = uVar9;
              }
              flush_pending(strm);
              bstate = s_00->pending;
              if ((ulong)s_00->pending == s_00->pending_buf_size) {
                BVar2 = '\x01';
                break;
              }
            }
            pBVar7 = s_00->gzhead->comment;
            uVar4 = s_00->gzindex;
            s_00->gzindex = uVar4 + 1;
            BVar2 = pBVar7[uVar4];
            uVar4 = s_00->pending;
            s_00->pending = uVar4 + 1;
            s_00->pending_buf[uVar4] = BVar2;
          } while (BVar2 != '\0');
          if ((s_00->gzhead->hcrc != 0) && (bstate < s_00->pending)) {
            uVar9 = crc32(strm->adler,s_00->pending_buf + bstate,s_00->pending - bstate);
            strm->adler = uVar9;
          }
          if (BVar2 == '\0') {
            s_00->status = 0x67;
          }
        }
      }
      if (s_00->status == 0x67) {
        if (s_00->gzhead->hcrc == 0) {
          s_00->status = 0x71;
        }
        else {
          if (s_00->pending_buf_size < (ulong)(s_00->pending + 2)) {
            flush_pending(strm);
          }
          if ((ulong)(s_00->pending + 2) <= s_00->pending_buf_size) {
            uVar9 = strm->adler;
            uVar4 = s_00->pending;
            s_00->pending = uVar4 + 1;
            s_00->pending_buf[uVar4] = (Bytef)uVar9;
            uVar9 = strm->adler;
            uVar4 = s_00->pending;
            s_00->pending = uVar4 + 1;
            s_00->pending_buf[uVar4] = (Bytef)(uVar9 >> 8);
            uVar9 = crc32(0,(uchar *)0x0,0);
            strm->adler = uVar9;
            s_00->status = 0x71;
          }
        }
      }
      if (s_00->pending == 0) {
        if (((strm->avail_in == 0) && (flush <= iVar3)) && (flush != 4)) {
          strm->msg = "buffer error";
          return -5;
        }
      }
      else {
        flush_pending(strm);
        if (strm->avail_out == 0) {
          s_00->last_flush = -1;
          return 0;
        }
      }
      if ((s_00->status == 0x29a) && (strm->avail_in != 0)) {
        strm->msg = "buffer error";
        strm_local._4_4_ = 0xfffffffb;
      }
      else {
        if (((strm->avail_in != 0) || (s_00->lookahead != 0)) ||
           ((flush != 0 && (s_00->status != 0x29a)))) {
          if (s_00->strategy == 2) {
            local_5c = deflate_huff(s_00,flush);
          }
          else {
            if (s_00->strategy == 3) {
              local_60 = deflate_rle(s_00,flush);
            }
            else {
              local_60 = (*configuration_table[s_00->level].func)(s_00,flush);
            }
            local_5c = local_60;
          }
          if ((local_5c == finish_started) || (local_5c == finish_done)) {
            s_00->status = 0x29a;
          }
          if ((local_5c == need_more) || (local_5c == finish_started)) {
            if (strm->avail_out == 0) {
              s_00->last_flush = -1;
            }
            return 0;
          }
          if (local_5c == block_done) {
            if (flush == 1) {
              _tr_align(s_00);
            }
            else if ((flush != 5) && (_tr_stored_block(s_00,(charf *)0x0,0,0), flush == 3)) {
              s_00->head[s_00->hash_size - 1] = 0;
              memset(s_00->head,0,(ulong)(s_00->hash_size - 1) << 1);
              if (s_00->lookahead == 0) {
                s_00->strstart = 0;
                s_00->block_start = 0;
              }
            }
            flush_pending(strm);
            if (strm->avail_out == 0) {
              s_00->last_flush = -1;
              return 0;
            }
          }
        }
        if (flush == 4) {
          if (s_00->wrap < 1) {
            strm_local._4_4_ = 1;
          }
          else {
            if (s_00->wrap == 2) {
              uVar9 = strm->adler;
              uVar4 = s_00->pending;
              s_00->pending = uVar4 + 1;
              s_00->pending_buf[uVar4] = (Bytef)uVar9;
              uVar9 = strm->adler;
              uVar4 = s_00->pending;
              s_00->pending = uVar4 + 1;
              s_00->pending_buf[uVar4] = (Bytef)(uVar9 >> 8);
              uVar9 = strm->adler;
              uVar4 = s_00->pending;
              s_00->pending = uVar4 + 1;
              s_00->pending_buf[uVar4] = (Bytef)(uVar9 >> 0x10);
              uVar9 = strm->adler;
              uVar4 = s_00->pending;
              s_00->pending = uVar4 + 1;
              s_00->pending_buf[uVar4] = (Bytef)(uVar9 >> 0x18);
              uVar9 = strm->total_in;
              uVar4 = s_00->pending;
              s_00->pending = uVar4 + 1;
              s_00->pending_buf[uVar4] = (Bytef)uVar9;
              uVar9 = strm->total_in;
              uVar4 = s_00->pending;
              s_00->pending = uVar4 + 1;
              s_00->pending_buf[uVar4] = (Bytef)(uVar9 >> 8);
              uVar9 = strm->total_in;
              uVar4 = s_00->pending;
              s_00->pending = uVar4 + 1;
              s_00->pending_buf[uVar4] = (Bytef)(uVar9 >> 0x10);
              uVar9 = strm->total_in;
              uVar4 = s_00->pending;
              s_00->pending = uVar4 + 1;
              s_00->pending_buf[uVar4] = (Bytef)(uVar9 >> 0x18);
            }
            else {
              putShortMSB(s_00,(uInt)(strm->adler >> 0x10));
              putShortMSB(s_00,(uint)strm->adler & 0xffff);
            }
            flush_pending(strm);
            if (0 < s_00->wrap) {
              s_00->wrap = -s_00->wrap;
            }
            strm_local._4_4_ = (uint)(s_00->pending == 0);
          }
        }
        else {
          strm_local._4_4_ = 0;
        }
      }
    }
  }
  return strm_local._4_4_;
}

Assistant:

int ZEXPORT deflate (z_streamp strm, int flush)
{
    int old_flush; /* value of flush param for previous deflate call */
    deflate_state *s;

    if (strm == Z_NULL || strm->state == Z_NULL ||
        flush > Z_BLOCK || flush < 0) {
        return Z_STREAM_ERROR;
    }
    s = strm->state;

    if (strm->next_out == Z_NULL ||
        (strm->next_in == Z_NULL && strm->avail_in != 0) ||
        (s->status == FINISH_STATE && flush != Z_FINISH)) {
        ERR_RETURN(strm, Z_STREAM_ERROR);
    }
    if (strm->avail_out == 0) ERR_RETURN(strm, Z_BUF_ERROR);

    s->strm = strm; /* just in case */
    old_flush = s->last_flush;
    s->last_flush = flush;

    /* Write the header */
    if (s->status == INIT_STATE) {
#ifdef GZIP
        if (s->wrap == 2) {
            strm->adler = crc32(0L, Z_NULL, 0);
            put_byte(s, 31);
            put_byte(s, 139);
            put_byte(s, 8);
            if (s->gzhead == Z_NULL) {
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, 0);
                put_byte(s, s->level == 9 ? 2 :
                            (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                             4 : 0));
                put_byte(s, OS_CODE);
                s->status = BUSY_STATE;
            }
            else {
                put_byte(s, (s->gzhead->text ? 1 : 0) +
                            (s->gzhead->hcrc ? 2 : 0) +
                            (s->gzhead->extra == Z_NULL ? 0 : 4) +
                            (s->gzhead->name == Z_NULL ? 0 : 8) +
                            (s->gzhead->comment == Z_NULL ? 0 : 16)
                        );
                put_byte(s, (Byte)(s->gzhead->time & 0xff));
                put_byte(s, (Byte)((s->gzhead->time >> 8) & 0xff));
                put_byte(s, (Byte)((s->gzhead->time >> 16) & 0xff));
                put_byte(s, (Byte)((s->gzhead->time >> 24) & 0xff));
                put_byte(s, s->level == 9 ? 2 :
                            (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2 ?
                             4 : 0));
                put_byte(s, s->gzhead->os & 0xff);
                if (s->gzhead->extra != Z_NULL) {
                    put_byte(s, s->gzhead->extra_len & 0xff);
                    put_byte(s, (s->gzhead->extra_len >> 8) & 0xff);
                }
                if (s->gzhead->hcrc)
                    strm->adler = crc32(strm->adler, s->pending_buf,
                                        s->pending);
                s->gzindex = 0;
                s->status = EXTRA_STATE;
            }
        }
        else
#endif
        {
            uInt header = (Z_DEFLATED + ((s->w_bits-8)<<4)) << 8;
            uInt level_flags;

            if (s->strategy >= Z_HUFFMAN_ONLY || s->level < 2)
                level_flags = 0;
            else if (s->level < 6)
                level_flags = 1;
            else if (s->level == 6)
                level_flags = 2;
            else
                level_flags = 3;
            header |= (level_flags << 6);
            if (s->strstart != 0) header |= PRESET_DICT;
            header += 31 - (header % 31);

            s->status = BUSY_STATE;
            putShortMSB(s, header);

            /* Save the adler32 of the preset dictionary: */
            if (s->strstart != 0) {
                putShortMSB(s, (uInt)(strm->adler >> 16));
                putShortMSB(s, (uInt)(strm->adler & 0xffff));
            }
            strm->adler = adler32(0L, Z_NULL, 0);
        }
    }
#ifdef GZIP
    if (s->status == EXTRA_STATE) {
        if (s->gzhead->extra != Z_NULL) {
            uInt beg = s->pending;  /* start of bytes to update crc */

            while (s->gzindex < (s->gzhead->extra_len & 0xffff)) {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size)
                        break;
                }
                put_byte(s, s->gzhead->extra[s->gzindex]);
                s->gzindex++;
            }
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (s->gzindex == s->gzhead->extra_len) {
                s->gzindex = 0;
                s->status = NAME_STATE;
            }
        }
        else
            s->status = NAME_STATE;
    }
    if (s->status == NAME_STATE) {
        if (s->gzhead->name != Z_NULL) {
            uInt beg = s->pending;  /* start of bytes to update crc */
            int val;

            do {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size) {
                        val = 1;
                        break;
                    }
                }
                val = s->gzhead->name[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (val == 0) {
                s->gzindex = 0;
                s->status = COMMENT_STATE;
            }
        }
        else
            s->status = COMMENT_STATE;
    }
    if (s->status == COMMENT_STATE) {
        if (s->gzhead->comment != Z_NULL) {
            uInt beg = s->pending;  /* start of bytes to update crc */
            int val;

            do {
                if (s->pending == s->pending_buf_size) {
                    if (s->gzhead->hcrc && s->pending > beg)
                        strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                            s->pending - beg);
                    flush_pending(strm);
                    beg = s->pending;
                    if (s->pending == s->pending_buf_size) {
                        val = 1;
                        break;
                    }
                }
                val = s->gzhead->comment[s->gzindex++];
                put_byte(s, val);
            } while (val != 0);
            if (s->gzhead->hcrc && s->pending > beg)
                strm->adler = crc32(strm->adler, s->pending_buf + beg,
                                    s->pending - beg);
            if (val == 0)
                s->status = HCRC_STATE;
        }
        else
            s->status = HCRC_STATE;
    }
    if (s->status == HCRC_STATE) {
        if (s->gzhead->hcrc) {
            if (s->pending + 2 > s->pending_buf_size)
                flush_pending(strm);
            if (s->pending + 2 <= s->pending_buf_size) {
                put_byte(s, (Byte)(strm->adler & 0xff));
                put_byte(s, (Byte)((strm->adler >> 8) & 0xff));
                strm->adler = crc32(0L, Z_NULL, 0);
                s->status = BUSY_STATE;
            }
        }
        else
            s->status = BUSY_STATE;
    }
#endif

    /* Flush as much pending output as possible */
    if (s->pending != 0) {
        flush_pending(strm);
        if (strm->avail_out == 0) {
            /* Since avail_out is 0, deflate will be called again with
             * more output space, but possibly with both pending and
             * avail_in equal to zero. There won't be anything to do,
             * but this is not an error situation so make sure we
             * return OK instead of BUF_ERROR at next call of deflate:
             */
            s->last_flush = -1;
            return Z_OK;
        }

    /* Make sure there is something to do and avoid duplicate consecutive
     * flushes. For repeated and useless calls with Z_FINISH, we keep
     * returning Z_STREAM_END instead of Z_BUF_ERROR.
     */
    } else if (strm->avail_in == 0 && flush <= old_flush &&
               flush != Z_FINISH) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* User must not provide more input after the first FINISH: */
    if (s->status == FINISH_STATE && strm->avail_in != 0) {
        ERR_RETURN(strm, Z_BUF_ERROR);
    }

    /* Start a new block or continue the current one.
     */
    if (strm->avail_in != 0 || s->lookahead != 0 ||
        (flush != Z_NO_FLUSH && s->status != FINISH_STATE)) {
        block_state bstate;

        bstate = s->strategy == Z_HUFFMAN_ONLY ? deflate_huff(s, flush) :
                    (s->strategy == Z_RLE ? deflate_rle(s, flush) :
                        (*(configuration_table[s->level].func))(s, flush));

        if (bstate == finish_started || bstate == finish_done) {
            s->status = FINISH_STATE;
        }
        if (bstate == need_more || bstate == finish_started) {
            if (strm->avail_out == 0) {
                s->last_flush = -1; /* avoid BUF_ERROR next call, see above */
            }
            return Z_OK;
            /* If flush != Z_NO_FLUSH && avail_out == 0, the next call
             * of deflate should use the same flush parameter to make sure
             * that the flush is complete. So we don't have to output an
             * empty block here, this will be done at next call. This also
             * ensures that for a very small output buffer, we emit at most
             * one empty block.
             */
        }
        if (bstate == block_done) {
            if (flush == Z_PARTIAL_FLUSH) {
                _tr_align(s);
            } else if (flush != Z_BLOCK) { /* FULL_FLUSH or SYNC_FLUSH */
                _tr_stored_block(s, (char*)0, 0L, 0);
                /* For a full flush, this empty block will be recognized
                 * as a special marker by inflate_sync().
                 */
                if (flush == Z_FULL_FLUSH) {
                    CLEAR_HASH(s);             /* forget history */
                    if (s->lookahead == 0) {
                        s->strstart = 0;
                        s->block_start = 0L;
                    }
                }
            }
            flush_pending(strm);
            if (strm->avail_out == 0) {
              s->last_flush = -1; /* avoid BUF_ERROR at next call, see above */
              return Z_OK;
            }
        }
    }
    Assert(strm->avail_out > 0, "bug2");

    if (flush != Z_FINISH) return Z_OK;
    if (s->wrap <= 0) return Z_STREAM_END;

    /* Write the trailer */
#ifdef GZIP
    if (s->wrap == 2) {
        put_byte(s, (Byte)(strm->adler & 0xff));
        put_byte(s, (Byte)((strm->adler >> 8) & 0xff));
        put_byte(s, (Byte)((strm->adler >> 16) & 0xff));
        put_byte(s, (Byte)((strm->adler >> 24) & 0xff));
        put_byte(s, (Byte)(strm->total_in & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 8) & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 16) & 0xff));
        put_byte(s, (Byte)((strm->total_in >> 24) & 0xff));
    }
    else
#endif
    {
        putShortMSB(s, (uInt)(strm->adler >> 16));
        putShortMSB(s, (uInt)(strm->adler & 0xffff));
    }
    flush_pending(strm);
    /* If avail_out is zero, the application will call deflate again
     * to flush the rest.
     */
    if (s->wrap > 0) s->wrap = -s->wrap; /* write the trailer only once! */
    return s->pending != 0 ? Z_OK : Z_STREAM_END;
}